

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::CopyBuffer::Implementation::recordCommands
          (Implementation *this,VkCommandBuffer cmdBuffer)

{
  deUint64 dVar1;
  VkBuffer buffer;
  VkDeviceSize VVar2;
  BufferResource *pBVar3;
  Buffer *pBVar4;
  VkBuffer *pVVar5;
  undefined1 local_80 [8];
  VkBufferMemoryBarrier barrier;
  undefined1 local_38 [8];
  VkBufferCopy copyRegion;
  DeviceInterface *vk;
  VkCommandBuffer cmdBuffer_local;
  Implementation *this_local;
  
  copyRegion.size = (VkDeviceSize)OperationContext::getDeviceInterface(this->m_context);
  pBVar3 = Resource::getBuffer(this->m_resource);
  ::vk::makeBufferCopy((VkBufferCopy *)local_38,0,0,pBVar3->size);
  VVar2 = copyRegion.size;
  if (this->m_mode == ACCESS_MODE_READ) {
    pBVar3 = Resource::getBuffer(this->m_resource);
    dVar1 = (pBVar3->handle).m_internal;
    pBVar4 = de::details::
             UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             ::operator*(&(this->m_hostBuffer).
                          super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                        );
    pVVar5 = synchronization::Buffer::operator*(pBVar4);
    barrier.size = pVVar5->m_internal;
    (**(code **)(*(long *)VVar2 + 0x2f8))(VVar2,cmdBuffer,dVar1,barrier.size,1,local_38);
    pBVar4 = de::details::
             UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             ::operator*(&(this->m_hostBuffer).
                          super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                        );
    pVVar5 = synchronization::Buffer::operator*(pBVar4);
    buffer.m_internal = pVVar5->m_internal;
    pBVar3 = Resource::getBuffer(this->m_resource);
    makeBufferMemoryBarrier((VkBufferMemoryBarrier *)local_80,0x1000,0x2000,buffer,0,pBVar3->size);
    (**(code **)(*(long *)copyRegion.size + 0x368))
              (copyRegion.size,cmdBuffer,0x1000,0x4000,0,0,0,1,local_80,0,0);
  }
  else {
    pBVar4 = de::details::
             UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             ::operator*(&(this->m_hostBuffer).
                          super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                        );
    pVVar5 = synchronization::Buffer::operator*(pBVar4);
    dVar1 = pVVar5->m_internal;
    pBVar3 = Resource::getBuffer(this->m_resource);
    (**(code **)(*(long *)VVar2 + 0x2f8))
              (VVar2,cmdBuffer,dVar1,(pBVar3->handle).m_internal,1,local_38);
  }
  return;
}

Assistant:

void recordCommands (const VkCommandBuffer cmdBuffer)
	{
		const DeviceInterface&	vk			= m_context.getDeviceInterface();
		const VkBufferCopy		copyRegion	= makeBufferCopy(0u, 0u, m_resource.getBuffer().size);

		if (m_mode == ACCESS_MODE_READ)
		{
			vk.cmdCopyBuffer(cmdBuffer, m_resource.getBuffer().handle, **m_hostBuffer, 1u, &copyRegion);

			// Insert a barrier so copied data is available to the host
			const VkBufferMemoryBarrier	barrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, **m_hostBuffer, 0u, m_resource.getBuffer().size);
			vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0u, DE_NULL, 1u, &barrier, 0u, DE_NULL);
		}
		else
			vk.cmdCopyBuffer(cmdBuffer, **m_hostBuffer, m_resource.getBuffer().handle, 1u, &copyRegion);
	}